

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  handcrafted_file_type hft;
  ggml_type gVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ggml_type gVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  size_t j_2;
  undefined4 extraout_var;
  FILE *pFVar20;
  ulong uVar21;
  size_t nbytes;
  long lVar22;
  result_type rVar23;
  size_t sVar24;
  ulong uVar25;
  char *pcVar26;
  long lVar27;
  size_type sVar28;
  undefined8 uVar29;
  size_type sVar30;
  ggml_backend_t pgVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  gguf_context *pgVar34;
  byte bVar35;
  long lVar36;
  pointer phVar37;
  long lVar38;
  _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
  *p_Var39;
  byte bVar40;
  uint uVar41;
  gguf_type gVar42;
  uint uVar43;
  undefined4 *puVar44;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar45;
  _Alloc_hider _Var46;
  mt19937 *pmVar47;
  char *pcVar48;
  unsigned_long *puVar49;
  gguf_type gVar50;
  uint64_t uVar51;
  byte bVar52;
  int j;
  bool bVar53;
  initializer_list<handcrafted_file_type> __l;
  mt19937 in_stack_ffffffffffffc3a8;
  uint local_28a8;
  uint local_28a4;
  long local_28a0;
  uint64_t n_2;
  pointer ppStack_2890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2888;
  string key;
  uint32_t alignment;
  char bad_magic [4];
  undefined4 uStack_2844;
  long alStack_2840 [9];
  uint64_t n_3;
  pointer local_27f0;
  ulong local_27d8;
  ulong local_27d0;
  ulong local_27c8;
  uint64_t offset;
  vector<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
  kv_types;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  tensor_configs;
  vector<handcrafted_file_type,_std::allocator<handcrafted_file_type>_> hfts;
  mt19937 rng;
  random_device rd;
  
  bVar40 = 0;
  if (argc < 3) {
    std::random_device::random_device(&rd);
    if (argc == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rng,argv[1],(allocator<char> *)bad_magic);
      iVar12 = std::__cxx11::stoi((string *)&rng,(size_t *)0x0,10);
      local_27c8 = CONCAT44(extraout_var,iVar12);
      std::__cxx11::string::~string((string *)&rng);
    }
    else {
      local_27c8 = std::random_device::_M_getval();
    }
    ggml_backend_dev_count();
    fputc(10,_stderr);
    puVar44 = &DAT_0010b054;
    pmVar47 = &rng;
    for (lVar36 = 0x1b; lVar36 != 0; lVar36 = lVar36 + -1) {
      *(undefined4 *)pmVar47->_M_x = *puVar44;
      puVar44 = puVar44 + (ulong)bVar40 * -2 + 1;
      pmVar47 = (mt19937 *)((long)pmVar47 + (ulong)bVar40 * -8 + 4);
    }
    __l._M_len = 0x1b;
    __l._M_array = (iterator)&rng;
    std::vector<handcrafted_file_type,_std::allocator<handcrafted_file_type>_>::vector
              (&hfts,__l,(allocator_type *)bad_magic);
    local_27d8 = local_27c8 & 0xffffffff;
    uVar13 = (int)local_27c8 + 1;
    local_28a4 = 0;
    local_28a8 = 0;
    for (phVar37 = hfts.
                   super__Vector_base<handcrafted_file_type,_std::allocator<handcrafted_file_type>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        phVar37 !=
        hfts.super__Vector_base<handcrafted_file_type,_std::allocator<handcrafted_file_type>_>.
        _M_impl.super__Vector_impl_data._M_finish; phVar37 = phVar37 + 1) {
      hft = *phVar37;
      if (hft == HANDCRAFTED_DATA_CUSTOM_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"DATA_CUSTOM_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_HEADER_BAD_VERSION_1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"HEADER_BAD_VERSION_1",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_HEADER_BAD_VERSION_FUTURE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"HEADER_BAD_VERSION_FUTURE",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_HEADER_BAD_N_TENSORS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"HEADER_BAD_N_TENSORS",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_HEADER_BAD_N_KV) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"HEADER_BAD_N_KV",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_HEADER_EMPTY) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"HEADER_EMPTY",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_KV_BAD_KEY_SIZE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"KV_BAD_KEY_SIZE",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_KV_BAD_TYPE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"KV_BAD_TYPE",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_KV_DUPLICATE_KEY) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"KV_DUPLICATE_KEY",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_KV_BAD_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"KV_BAD_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_KV_SUCCESS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"KV_RANDOM_KV",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_BAD_NAME_SIZE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_BAD_NAME_SIZE",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_BAD_N_DIMS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_BAD_N_DIMS",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_BAD_SHAPE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_BAD_SHAPE",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_NE_TOO_BIG) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_NE_TOO_BIG",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_BAD_TYPE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_BAD_TYPE",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_BAD_OFFSET) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_BAD_OFFSET",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_DUPLICATE_NAME) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_DUPLICATE_NAME",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_BAD_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_BAD_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_INCONSISTENT_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_INCONSISTENT_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_SUCCESS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_SUCCESS",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_TENSORS_CUSTOM_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"TENSORS_CUSTOM_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_DATA_NOT_ENOUGH_DATA) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"DATA_NOT_ENOUGH_DATA",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_DATA_BAD_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"DATA_BAD_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_DATA_INCONSISTENT_ALIGN) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"DATA_INCONSISTENT_ALIGN",(allocator<char> *)bad_magic);
      }
      else if (hft == HANDCRAFTED_DATA_SUCCESS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"DATA_SUCCESS",(allocator<char> *)bad_magic);
      }
      else {
        if (hft != HANDCRAFTED_HEADER_BAD_MAGIC) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x54,"fatal error");
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rng,"HEADER_BAD_MAGIC",(allocator<char> *)bad_magic);
      }
      printf("%s: handcrafted_file_type=%s\n","test_handcrafted_file",rng._M_x[0]);
      std::__cxx11::string::~string((string *)&rng);
      pFVar20 = tmpfile();
      if (pFVar20 == (FILE *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                   ,0x2c1,"GGML_ASSERT(%s) failed","file");
      }
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&rng,local_27d8);
      alignment = 0x20;
      if (hft == HANDCRAFTED_HEADER_BAD_MAGIC) {
        builtin_strncpy(bad_magic,"FUGG",4);
        helper_write((FILE *)pFVar20,(allocator<char> *)bad_magic,4);
LAB_00105d5e:
        bad_magic[0] = '\x03';
        bad_magic[1] = '\0';
        bad_magic[2] = '\0';
        bad_magic[3] = '\0';
        helper_write<unsigned_int>((FILE *)pFVar20,(uint *)bad_magic);
        tensor_configs.
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tensor_configs.
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tensor_configs.
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (1999 < hft) {
          get_tensor_configs((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                              *)bad_magic,&rng);
          std::
          vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
          ::_M_move_assign(&tensor_configs,(allocator<char> *)bad_magic);
          std::
          _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
          ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                           *)bad_magic);
          goto LAB_00105e43;
        }
        if (hft != HANDCRAFTED_HEADER_BAD_N_TENSORS) goto LAB_00105e3f;
        _bad_magic = (pointer)0xffffffffffffffff;
        helper_write<unsigned_long>((FILE *)pFVar20,(unsigned_long *)bad_magic);
        kv_types.
        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        kv_types.
        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        kv_types.
        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _bad_magic = (pointer)0x0;
      }
      else {
        helper_write((FILE *)pFVar20,"GGUF",4);
        if (hft == HANDCRAFTED_HEADER_BAD_VERSION_FUTURE) {
          bad_magic[0] = '\x04';
          bad_magic[1] = '\0';
          bad_magic[2] = '\0';
          bad_magic[3] = '\0';
          helper_write<unsigned_int>((FILE *)pFVar20,(uint *)bad_magic);
        }
        else {
          if (hft != HANDCRAFTED_HEADER_BAD_VERSION_1) goto LAB_00105d5e;
          bad_magic[0] = '\x01';
          bad_magic[1] = '\0';
          bad_magic[2] = '\0';
          bad_magic[3] = '\0';
          helper_write<unsigned_int>((FILE *)pFVar20,(uint *)bad_magic);
        }
LAB_00105e3f:
        tensor_configs.
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tensor_configs.
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tensor_configs.
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00105e43:
        _bad_magic = (pointer)(((long)tensor_configs.
                                      super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)tensor_configs.
                                     super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
        helper_write<unsigned_long>((FILE *)pFVar20,(unsigned_long *)bad_magic);
        kv_types.
        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        kv_types.
        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        kv_types.
        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (hft < 1000) {
          _bad_magic = (pointer)0x0;
        }
        else {
          pmVar45 = &rng;
          puVar49 = (unsigned_long *)&stack0xffffffffffffc3a8;
          for (lVar36 = 0x271; lVar36 != 0; lVar36 = lVar36 + -1) {
            *puVar49 = pmVar45->_M_x[0];
            pmVar45 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       *)((long)pmVar45 + (ulong)bVar40 * -0x10 + 8);
            puVar49 = puVar49 + (ulong)bVar40 * -2 + 1;
          }
          get_kv_types(in_stack_ffffffffffffc3a8);
          std::
          vector<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
          ::_M_move_assign(&kv_types,(allocator<char> *)bad_magic);
          std::
          _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
          ::~_Vector_base((_Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                           *)bad_magic);
          _bad_magic = (pointer)((long)kv_types.
                                       super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)kv_types.
                                       super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        if (hft == HANDCRAFTED_HEADER_BAD_N_KV) {
          _bad_magic = (pointer)0xffffffffffffffff;
        }
        else if ((((hft == HANDCRAFTED_KV_BAD_ALIGN) || (hft == HANDCRAFTED_TENSORS_BAD_ALIGN)) ||
                 (hft == HANDCRAFTED_TENSORS_CUSTOM_ALIGN)) ||
                ((hft == HANDCRAFTED_DATA_CUSTOM_ALIGN || (hft == HANDCRAFTED_DATA_BAD_ALIGN)))) {
          _bad_magic = _bad_magic + 1;
        }
      }
      helper_write<unsigned_long>((FILE *)pFVar20,(unsigned_long *)bad_magic);
      if (hft < 1000) {
        while (uVar21 = ftell(pFVar20), (uVar21 & 0x1f) != 0) {
          _bad_magic = _bad_magic & 0xffffffffffffff00;
          helper_write<char>((FILE *)pFVar20,bad_magic);
        }
        rewind(pFVar20);
      }
      else {
        for (lVar36 = 0;
            lVar36 < (int)((ulong)((long)kv_types.
                                         super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)kv_types.
                                        super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
            lVar36 = lVar36 + 1) {
          gVar42 = GGUF_TYPE_COUNT;
          gVar50 = gVar42;
          if (hft != HANDCRAFTED_KV_BAD_TYPE) {
            gVar42 = kv_types.
                     super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar36].first;
            gVar50 = kv_types.
                     super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar36].second;
          }
          std::__cxx11::to_string
                    ((string *)bad_magic,(uint)lVar36 >> (hft == HANDCRAFTED_KV_DUPLICATE_KEY));
          std::operator+(&key,"my_key_",(string *)bad_magic);
          std::__cxx11::string::~string((string *)bad_magic);
          if (hft == HANDCRAFTED_KV_BAD_KEY_SIZE) {
            _bad_magic = (pointer)0xffffffffffffffff;
            helper_write<unsigned_long>((FILE *)pFVar20,(unsigned_long *)bad_magic);
          }
          else {
            _bad_magic = (pointer)key._M_string_length;
            helper_write<unsigned_long>((FILE *)pFVar20,(unsigned_long *)bad_magic);
          }
          helper_write((FILE *)pFVar20,key._M_dataplus._M_p,key._M_string_length);
          bad_magic[0] = (char)gVar42;
          bad_magic[1] = (char)(gVar42 >> 8);
          bad_magic[2] = (char)(gVar42 >> 0x10);
          bad_magic[3] = (char)(gVar42 >> 0x18);
          helper_write<int>((FILE *)pFVar20,(int *)bad_magic);
          for (lVar38 = 0; lVar38 != 0x10; lVar38 = lVar38 + 1) {
            rVar23 = std::
                     mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     ::operator()(&rng);
            uVar17 = (uint)rVar23 | 0x1010101;
            if (gVar50 != GGUF_TYPE_STRING && gVar42 != GGUF_TYPE_STRING) {
              uVar17 = (uint)rVar23;
            }
            *(uint *)(bad_magic + lVar38 * 4) = uVar17;
          }
          if (gVar42 == GGUF_TYPE_STRING) {
            rVar23 = std::
                     mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     ::operator()(&rng);
            n_2 = (uint64_t)((uint)rVar23 & 0x3f);
            helper_write<unsigned_long>((FILE *)pFVar20,&n_2);
            helper_write((FILE *)pFVar20,bad_magic,n_2);
          }
          else if (gVar42 == GGUF_TYPE_ARRAY) {
            n_2 = CONCAT44(n_2._4_4_,gVar50);
            helper_write<int>((FILE *)pFVar20,(int *)&n_2);
            if (gVar50 == GGUF_TYPE_STRING) {
              rVar23 = std::
                       mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       ::operator()(&rng);
              n_2 = rVar23 % 0x11;
              helper_write<unsigned_long>((FILE *)pFVar20,&n_2);
              pcVar48 = bad_magic;
              uVar51 = n_2;
              while (bVar10 = uVar51 != 0, uVar51 = uVar51 - 1, bVar10) {
                rVar23 = std::
                         mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         ::operator()(&rng);
                n_3 = rVar23 % 5;
                helper_write<unsigned_long>((FILE *)pFVar20,&n_3);
                helper_write((FILE *)pFVar20,pcVar48,n_3);
                pcVar48 = pcVar48 + 4;
              }
            }
            else {
              uVar21 = gguf_type_size(gVar50);
              rVar23 = std::
                       mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       ::operator()(&rng);
              n_2 = ((uint)rVar23 & 0x3f) / uVar21;
              helper_write<unsigned_long>((FILE *)pFVar20,&n_2);
              helper_write((FILE *)pFVar20,bad_magic,uVar21 * n_2);
            }
          }
          else {
            nbytes = 1;
            if (hft != HANDCRAFTED_KV_BAD_TYPE) {
              nbytes = gguf_type_size(gVar42);
            }
            helper_write((FILE *)pFVar20,bad_magic,nbytes);
          }
          std::__cxx11::string::~string((string *)&key);
        }
        if (((hft == HANDCRAFTED_KV_BAD_ALIGN) || (hft == HANDCRAFTED_TENSORS_BAD_ALIGN)) ||
           ((hft == HANDCRAFTED_TENSORS_CUSTOM_ALIGN ||
            ((hft == HANDCRAFTED_DATA_BAD_ALIGN || (hft == HANDCRAFTED_DATA_CUSTOM_ALIGN)))))) {
          _bad_magic = (pointer)0x11;
          helper_write<unsigned_long>((FILE *)pFVar20,(unsigned_long *)bad_magic);
          helper_write((FILE *)pFVar20,"general.alignment",0x11);
          key._M_dataplus._M_p._0_4_ = 4;
          helper_write<int>((FILE *)pFVar20,(int *)&key);
          bVar10 = expect_context_not_null(hft);
          alignment = 0xd;
          if (bVar10) {
            alignment = 1;
          }
          helper_write<unsigned_int>((FILE *)pFVar20,&alignment);
        }
        if ((int)hft < 2000) {
          uVar21 = (ulong)alignment;
          while (lVar36 = ftell(pFVar20), lVar36 % (long)uVar21 != 0) {
            _bad_magic = _bad_magic & 0xffffffffffffff00;
            helper_write<char>((FILE *)pFVar20,bad_magic);
          }
        }
        else {
          uVar17 = 1;
          if ((hft != HANDCRAFTED_TENSORS_INCONSISTENT_ALIGN) &&
             (uVar17 = 1, hft != HANDCRAFTED_DATA_INCONSISTENT_ALIGN)) {
            uVar17 = alignment;
          }
          offset = 0;
          local_28a0._0_4_ = uVar17 - 1;
          uVar51 = 0;
          for (lVar36 = 0;
              lVar36 < (int)(((long)tensor_configs.
                                    super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)tensor_configs.
                                   super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
              lVar36 = lVar36 + 1) {
            gVar1 = tensor_configs.
                    super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar36].first;
            _bad_magic = (pointer)tensor_configs.
                                  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar36].second._M_elems
                                  [0];
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&key,"my_tensor",(allocator<char> *)&n_2);
            if (hft != HANDCRAFTED_TENSORS_DUPLICATE_NAME) {
              std::__cxx11::to_string((string *)&n_3,(int)lVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &n_2,"_",(string *)&n_3);
              std::__cxx11::string::append((string *)&key);
              std::__cxx11::string::~string((string *)&n_2);
              std::__cxx11::string::~string((string *)&n_3);
              if ((hft == HANDCRAFTED_TENSORS_BAD_NAME_SIZE) &&
                 (std::__cxx11::string::append((char *)&key), key._M_string_length < 0x40)) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                           ,0x14d,"GGML_ASSERT(%s) failed","name.length() >= GGML_MAX_NAME");
              }
            }
            n_2 = key._M_string_length;
            helper_write<unsigned_long>((FILE *)pFVar20,&n_2);
            helper_write((FILE *)pFVar20,key._M_dataplus._M_p,key._M_string_length);
            uVar41 = 3;
            do {
              uVar14 = uVar41;
              uVar43 = (uint)(hft == HANDCRAFTED_TENSORS_NE_TOO_BIG);
              if (uVar14 == 0) break;
              uVar41 = uVar14 - 1;
              uVar43 = uVar14;
            } while (*(long *)(bad_magic + (ulong)uVar14 * 8) == 1);
            n_3 = CONCAT44(n_3._4_4_,uVar43 + 1);
            if (hft == HANDCRAFTED_TENSORS_BAD_N_DIMS) {
              n_2 = CONCAT44(n_2._4_4_,5);
              helper_write<unsigned_int>((FILE *)pFVar20,(uint *)&n_2);
              uVar41 = uVar43 + 1;
LAB_00106579:
              helper_write((FILE *)pFVar20,bad_magic,(ulong)uVar41 << 3);
            }
            else {
              helper_write<unsigned_int>((FILE *)pFVar20,(uint *)&n_3);
              uVar41 = (uint)n_3;
              uVar43 = (uint)n_3;
              if (hft == HANDCRAFTED_TENSORS_BAD_SHAPE) {
                while (uVar43 != 0) {
                  n_2 = 0xffffffffffffffff;
                  helper_write<long>((FILE *)pFVar20,(long *)&n_2);
                  uVar43 = uVar43 - 1;
                }
              }
              else {
                if (hft != HANDCRAFTED_TENSORS_NE_TOO_BIG) goto LAB_00106579;
                while (uVar43 != 0) {
                  n_2 = 0x1fffffffc;
                  helper_write<long>((FILE *)pFVar20,(long *)&n_2);
                  uVar43 = uVar43 - 1;
                }
              }
            }
            gVar15 = gVar1;
            if (hft == HANDCRAFTED_TENSORS_BAD_TYPE) {
              gVar15 = GGML_TYPE_COUNT;
            }
            n_2 = CONCAT44(n_2._4_4_,gVar15);
            helper_write<int>((FILE *)pFVar20,(int *)&n_2);
            if (hft == HANDCRAFTED_TENSORS_BAD_OFFSET) {
              n_2 = 0xffffffffffffffff;
              helper_write<unsigned_long>((FILE *)pFVar20,&n_2);
            }
            else {
              helper_write<unsigned_long>((FILE *)pFVar20,&offset);
            }
            _Var46._M_p = _bad_magic;
            for (uVar21 = 1; uVar21 < uVar41; uVar21 = uVar21 + 1) {
              _Var46._M_p = _Var46._M_p * *(long *)(bad_magic + uVar21 * 8);
            }
            iVar12 = ggml_row_size(gVar1,_Var46._M_p);
            uVar51 = (iVar12 + (int)local_28a0 & -uVar17) + offset;
            offset = uVar51;
            std::__cxx11::string::~string((string *)&key);
          }
          while (lVar36 = ftell(pFVar20), lVar36 % (long)(ulong)uVar17 != 0) {
            _bad_magic = _bad_magic & 0xffffffffffffff00;
            helper_write<char>((FILE *)pFVar20,bad_magic);
          }
          if (2999 < (int)hft) {
            std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::seed(&rng,(ulong)uVar13);
            for (lVar36 = 0; uVar51 - (hft == HANDCRAFTED_DATA_NOT_ENOUGH_DATA) != lVar36;
                lVar36 = lVar36 + 1) {
              bad_magic[0] = (char)lVar36;
              sVar24 = fwrite(bad_magic,1,1,pFVar20);
              if (sVar24 != 1) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                           ,0x96,"GGML_ASSERT(%s) failed",
                           "fwrite(&val, 1, sizeof(val), file) == sizeof(val)");
              }
            }
          }
        }
        rewind(pFVar20);
      }
      std::
      _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
      ::~_Vector_base(&kv_types.
                       super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                     );
      std::
      _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
      ::~_Vector_base(&tensor_configs.
                       super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                     );
      kv_types.
      super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      p_Var39 = (_Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                 *)0x0;
      if (2999 < (int)hft) {
        p_Var39 = &kv_types.
                   super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
        ;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = p_Var39;
      lVar36 = gguf_init_from_file_impl(pFVar20,(gguf_init_params)(auVar2 << 0x40));
      bVar10 = expect_context_not_null(hft);
      pcVar48 = "%s:   - context_null: ";
      if (bVar10) {
        pcVar48 = "%s:   - context_not_null: ";
      }
      printf(pcVar48);
      if ((lVar36 != 0) == bVar10) {
        puts("\x1b[1;32mOK\x1b[0m");
        local_28a8 = local_28a8 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      if ((int)hft < 3000) {
        bVar53 = hft == HANDCRAFTED_TENSORS_CUSTOM_ALIGN;
        if (bVar10) goto LAB_001068b1;
LAB_001073ad:
        local_28a4 = local_28a4 + 1;
      }
      else if (bVar10) {
        bVar53 = hft == HANDCRAFTED_DATA_CUSTOM_ALIGN;
LAB_001068b1:
        printf("%s:   - check_header: ");
        if (lVar36 == 0) {
LAB_00106a79:
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        else {
          std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::seed(&rng,local_27d8);
          _bad_magic = (pointer)0x0;
          if ((int)hft < 2000) {
            key.field_2._M_allocated_capacity = 0;
            key._M_dataplus._M_p = (pointer)0x0;
            key._M_string_length = 0;
            if (999 < (int)hft) goto LAB_00106998;
          }
          else {
            get_tensor_configs((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                *)&key,&rng);
            std::
            vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
            ::_M_move_assign((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                              *)bad_magic,&key);
            std::
            _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
            ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                             *)&key);
            key._M_dataplus._M_p = (pointer)0x0;
            key._M_string_length = 0;
            key.field_2._M_allocated_capacity = 0;
LAB_00106998:
            key.field_2._M_allocated_capacity = 0;
            key._M_string_length = 0;
            key._M_dataplus._M_p = (pointer)0x0;
            pmVar45 = &rng;
            puVar49 = (unsigned_long *)&stack0xffffffffffffc3a8;
            for (lVar38 = 0x271; lVar38 != 0; lVar38 = lVar38 + -1) {
              *puVar49 = pmVar45->_M_x[0];
              pmVar45 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)((long)pmVar45 + (ulong)bVar40 * -0x10 + 8);
              puVar49 = puVar49 + (ulong)bVar40 * -2 + 1;
            }
            get_kv_types(in_stack_ffffffffffffc3a8);
            std::
            vector<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
            ::_M_move_assign((vector<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                              *)&key);
            std::
            _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
            ::~_Vector_base((_Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                             *)&n_2);
          }
          iVar12 = gguf_get_version(lVar36);
          lVar38 = gguf_get_n_tensors(lVar36);
          _Var46._M_p = _bad_magic;
          lVar22 = gguf_get_n_kv(lVar36);
          uVar21 = key._M_string_length - (long)key._M_dataplus._M_p;
          std::
          _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
          ::~_Vector_base((_Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                           *)&key);
          std::
          _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
          ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                           *)bad_magic);
          if (((lVar22 != (int)((int)(uVar21 >> 3) + (uint)bVar53)) ||
              (lVar38 != (int)(-(long)_Var46._M_p / 0x28))) || (iVar12 != 3)) goto LAB_00106a79;
          puts("\x1b[1;32mOK\x1b[0m");
          local_28a8 = local_28a8 + 1;
        }
        bVar10 = !bVar10;
        if ((int)hft < 1000 || bVar10) {
          local_28a4 = local_28a4 + 2;
        }
        else {
          printf("%s:   - check_kv: ");
          if (lVar36 == 0) {
LAB_00106ebd:
            puts("\x1b[1;31mFAIL\x1b[0m");
          }
          else {
            std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::seed(&rng,local_27d8);
            local_2888._M_allocated_capacity = 0;
            n_2 = 0;
            ppStack_2890 = (pointer)0x0;
            if (1999 < hft) {
              get_tensor_configs((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                  *)bad_magic,&rng);
              std::
              vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
              ::_M_move_assign((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                *)&n_2,(_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                        *)bad_magic);
              std::
              _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
              ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                               *)bad_magic);
            }
            pmVar45 = &rng;
            puVar49 = (unsigned_long *)&stack0xffffffffffffc3a8;
            for (lVar38 = 0x271; lVar38 != 0; lVar38 = lVar38 + -1) {
              *puVar49 = pmVar45->_M_x[0];
              pmVar45 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)((long)pmVar45 + (ulong)bVar40 * -0x10 + 8);
              puVar49 = puVar49 + (ulong)bVar40 * -2 + 1;
            }
            get_kv_types(in_stack_ffffffffffffc3a8);
            uVar21 = 0;
            bVar35 = 1;
            while ((long)uVar21 < (long)(int)((long)local_27f0 - n_3 >> 3)) {
              gVar42 = *(gguf_type *)(n_3 + uVar21 * 8);
              gVar50 = *(gguf_type *)(n_3 + 4 + uVar21 * 8);
              local_27d0 = uVar21;
              std::__cxx11::to_string((string *)bad_magic,(int)uVar21);
              std::operator+(&key,"my_key_",(string *)bad_magic);
              std::__cxx11::string::~string((string *)bad_magic);
              for (lVar38 = 0; lVar38 != 0x10; lVar38 = lVar38 + 1) {
                rVar23 = std::
                         mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         ::operator()(&rng);
                uVar17 = (uint)rVar23 | 0x1010101;
                if (gVar50 != GGUF_TYPE_STRING && gVar42 != GGUF_TYPE_STRING) {
                  uVar17 = (uint)rVar23;
                }
                *(uint *)(bad_magic + lVar38 * 4) = uVar17;
              }
              iVar12 = gguf_find_key(lVar36,key._M_dataplus._M_p);
              if (gVar42 == GGUF_TYPE_ARRAY) {
                uVar21 = gguf_type_size(gVar50);
                uVar25 = gguf_get_arr_n(lVar36);
                pcVar48 = bad_magic;
                if (gVar50 == GGUF_TYPE_STRING) {
                  rVar23 = std::
                           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           ::operator()(&rng);
                  bVar52 = 0;
                  if (uVar25 == rVar23 % 0x11) {
                    bVar52 = bVar35;
                    for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
                      pcVar26 = (char *)gguf_get_arr_str(lVar36,(long)iVar12,uVar21);
                      sVar24 = strlen(pcVar26);
                      rVar23 = std::
                               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               ::operator()(&rng);
                      bVar35 = 0;
                      if (sVar24 == rVar23 % 5) {
                        iVar16 = strncmp(pcVar26,pcVar48,sVar24);
                        bVar35 = iVar16 == 0 & bVar52;
                      }
                      pcVar48 = pcVar48 + 4;
                      bVar52 = bVar35;
                    }
                  }
                }
                else {
                  rVar23 = std::
                           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           ::operator()(&rng);
                  uVar17 = (uint)rVar23 & 0x3f;
                  bVar52 = 0;
                  if (uVar25 == uVar17 / uVar21) {
                    pcVar26 = (char *)gguf_get_arr_data(lVar36,(long)iVar12,(ulong)uVar17 % uVar21);
                    if (gVar50 == GGUF_TYPE_BOOL) {
                      bVar52 = bVar35;
                      for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
                        bVar52 = bVar52 & (pcVar26[uVar21] == '\0') != (bad_magic[uVar21] != '\0');
                      }
                    }
                    else {
                      bVar11 = std::__equal<true>::equal<char>
                                         (pcVar48,bad_magic + uVar25 * uVar21,pcVar26);
                      bVar52 = bVar11 & bVar35;
                    }
                  }
                }
              }
              else {
                if (gVar42 == GGUF_TYPE_STRING) {
                  pcVar48 = (char *)gguf_get_val_str(lVar36);
                  sVar24 = strlen(pcVar48);
                  rVar23 = std::
                           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           ::operator()(&rng);
                  if (sVar24 != ((uint)rVar23 & 0x3f)) {
                    bVar52 = 0;
                    goto LAB_00106d90;
                  }
                  bVar11 = std::__equal<true>::equal<char>(pcVar48,pcVar48 + sVar24,bad_magic);
                }
                else {
                  pcVar48 = (char *)gguf_get_val_data(lVar36,(long)iVar12);
                  if (gVar42 == GGUF_TYPE_BOOL) {
                    bVar11 = (*pcVar48 == '\0') != (bad_magic[0] != '\0');
                  }
                  else {
                    lVar38 = gguf_type_size(gVar42);
                    bVar11 = std::__equal<true>::equal<char>(bad_magic,bad_magic + lVar38,pcVar48);
                  }
                }
                bVar52 = bVar11 & bVar35;
              }
LAB_00106d90:
              std::__cxx11::string::~string((string *)&key);
              bVar35 = bVar52;
              uVar21 = local_27d0 + 1;
            }
            lVar22 = gguf_get_alignment(lVar36);
            lVar38 = 0x20;
            if (bVar53 != false) {
              lVar38 = 1;
            }
            std::
            _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
            ::~_Vector_base((_Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                             *)&n_3);
            std::
            _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
            ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                             *)&n_2);
            if ((lVar22 == lVar38 & bVar35) != 1) goto LAB_00106ebd;
            puts("\x1b[1;32mOK\x1b[0m");
            local_28a8 = local_28a8 + 1;
          }
          local_28a4 = local_28a4 + 3;
        }
        if (1999 < (int)hft && !bVar10) {
          printf("%s:   - check_tensors: ");
          if (lVar36 == 0) {
LAB_0010717c:
            puts("\x1b[1;31mFAIL\x1b[0m");
          }
          else {
            std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::seed(&rng,local_27d8);
            get_tensor_configs((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                *)&n_3,&rng);
            pmVar45 = &rng;
            puVar49 = (unsigned_long *)&stack0xffffffffffffc3a8;
            for (lVar38 = 0x271; lVar38 != 0; lVar38 = lVar38 + -1) {
              *puVar49 = pmVar45->_M_x[0];
              pmVar45 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)((long)pmVar45 + (ulong)bVar40 * -0x10 + 8);
              puVar49 = puVar49 + (ulong)bVar40 * -2 + 1;
            }
            get_kv_types(in_stack_ffffffffffffc3a8);
            std::
            _Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
            ::~_Vector_base((_Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                             *)&tensor_configs);
            uVar17 = gguf_find_key(lVar36,"general.alignment");
            iVar12 = 0x20;
            if (-1 < (int)uVar17) {
              iVar12 = gguf_get_val_u32(lVar36,uVar17 & 0x7fffffff);
            }
            local_27d0 = (ulong)(uint)-iVar12;
            bVar53 = true;
            local_28a0 = 0;
            for (lVar38 = 0; lVar38 < (int)((long)((long)local_27f0 - n_3) / 0x28);
                lVar38 = lVar38 + 1) {
              iVar16 = *(int *)(n_3 + lVar38 * 0x28);
              _bad_magic = *(pointer *)(n_3 + 8 + lVar38 * 0x28);
              std::__cxx11::to_string((string *)&n_2,(int)lVar38);
              std::operator+(&key,"my_tensor_",(string *)&n_2);
              std::__cxx11::string::~string((string *)&n_2);
              uVar17 = gguf_find_tensor(lVar36,key._M_dataplus._M_p);
              if ((int)uVar17 < 0) {
                bVar53 = false;
              }
              else {
                uVar17 = uVar17 & 0x7fffffff;
                pcVar48 = (char *)gguf_get_tensor_name(lVar36,uVar17);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&n_2,pcVar48,(allocator<char> *)&offset);
                bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&n_2,&key);
                std::__cxx11::string::~string((string *)&n_2);
                iVar18 = gguf_get_tensor_type(lVar36,uVar17);
                lVar27 = gguf_get_tensor_offset(lVar36,uVar17);
                _Var46._M_p = _bad_magic;
                for (lVar22 = 1; lVar22 != 4; lVar22 = lVar22 + 1) {
                  _Var46._M_p = _Var46._M_p * *(long *)(bad_magic + lVar22 * 8);
                }
                iVar19 = ggml_row_size(iVar16,_Var46._M_p);
                bVar53 = (bool)(!bVar11 & bVar53 & (iVar18 == iVar16 && lVar27 == local_28a0));
                local_28a0 = local_28a0 + (ulong)(iVar19 + iVar12 + -1 & (uint)local_27d0);
              }
              std::__cxx11::string::~string((string *)&key);
            }
            std::
            _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
            ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                             *)&n_3);
            if (!bVar53) goto LAB_0010717c;
            puts("\x1b[1;32mOK\x1b[0m");
            local_28a8 = local_28a8 + 1;
          }
          local_28a4 = local_28a4 + 1;
        }
        if (2999 < (int)hft && !bVar10) {
          printf("%s:   - check_tensor_data: ");
          if (lVar36 != 0) {
            std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::seed(&rng,local_27d8);
            get_tensor_configs((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                                *)&n_3,&rng);
            bVar10 = true;
            for (lVar38 = 0; lVar38 < (int)((long)((long)local_27f0 - n_3) / 0x28);
                lVar38 = lVar38 + 1) {
              _bad_magic = *(pointer *)(n_3 + 8 + lVar38 * 0x28);
              _Var46._M_p = _bad_magic;
              for (lVar22 = 1; lVar22 != 4; lVar22 = lVar22 + 1) {
                _Var46._M_p = _Var46._M_p * *(long *)(bad_magic + lVar22 * 8);
              }
              sVar28 = ggml_row_size(*(undefined4 *)(n_3 + lVar38 * 0x28),_Var46._M_p,
                                     (long)((long)local_27f0 - n_3) % 0x28);
              std::__cxx11::to_string((string *)&n_2,(int)lVar38);
              std::operator+(&key,"my_tensor_",(string *)&n_2);
              std::__cxx11::string::~string((string *)&n_2);
              uVar29 = gguf_find_tensor(lVar36,key._M_dataplus._M_p);
              lVar22 = gguf_get_tensor_offset(lVar36,uVar29);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&n_2,sVar28,
                         (allocator_type *)&tensor_configs);
              lVar27 = gguf_get_data_offset(lVar36);
              iVar12 = fseek(pFVar20,lVar27 + lVar22,0);
              if (iVar12 != 0) {
                uVar29 = 0x283;
                pcVar48 = "fseek(file, gguf_get_data_offset(gguf_ctx) + offset, SEEK_SET) == 0";
LAB_00107dbf:
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                           ,uVar29,"GGML_ASSERT(%s) failed",pcVar48);
              }
              sVar24 = fread((void *)n_2,1,(long)ppStack_2890 - n_2,pFVar20);
              if (sVar24 != (long)ppStack_2890 - n_2) {
                uVar29 = 0x284;
                pcVar48 = "fread(data.data(), 1, data.size(), file) == data.size()";
                goto LAB_00107dbf;
              }
              for (sVar30 = 0; sVar28 != sVar30; sVar30 = sVar30 + 1) {
                bVar10 = (bool)(bVar10 & (char)((char)sVar30 + (char)lVar22) ==
                                         *(char *)(n_2 + sVar30));
              }
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&n_2);
              std::__cxx11::string::~string((string *)&key);
            }
            std::
            _Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
            ::~_Vector_base((_Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                             *)&n_3);
            if (bVar10) {
              puts("\x1b[1;32mOK\x1b[0m");
              local_28a8 = local_28a8 + 1;
              goto LAB_001073ad;
            }
          }
          puts("\x1b[1;31mFAIL\x1b[0m");
          goto LAB_001073ad;
        }
      }
      else {
        printf("%s:   - no_dangling_ggml_context_pointer: ");
        if (kv_types.
            super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          puts("\x1b[1;32mOK\x1b[0m");
          local_28a8 = local_28a8 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        local_28a4 = local_28a4 + 2;
      }
      fclose(pFVar20);
      if (lVar36 != 0) {
        ggml_free(kv_types.
                  super__Vector_base<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
        gguf_free(lVar36);
      }
      putchar(10);
    }
    std::_Vector_base<handcrafted_file_type,_std::allocator<handcrafted_file_type>_>::~_Vector_base
              (&hfts.
                super__Vector_base<handcrafted_file_type,_std::allocator<handcrafted_file_type>_>);
    for (uVar21 = 0; uVar25 = ggml_backend_dev_count(), uVar21 < uVar25; uVar21 = uVar21 + 1) {
      uVar29 = ggml_backend_dev_get(uVar21);
      key._M_dataplus._M_p._0_2_ = 1;
      uVar25 = 0;
      while (uVar25 != 2) {
        local_27d0 = uVar25;
        bVar10 = *(bool *)((long)&key._M_dataplus._M_p + uVar25);
        pgVar31 = (ggml_backend_t)ggml_backend_dev_init(uVar29,0);
        uVar32 = ggml_backend_dev_description(uVar29);
        uVar33 = ggml_backend_name(pgVar31);
        pcVar48 = "no";
        if (bVar10 != false) {
          pcVar48 = "yes";
        }
        printf("%s: device=%s, backend=%s, only_meta=%s\n","test_roundtrip",uVar32,uVar33,pcVar48);
        get_random_gguf_context((random_gguf_context_result *)&rng,pgVar31,(uint)local_27c8);
        uVar6 = rng._M_x[2];
        uVar5 = rng._M_x[1];
        uVar4 = rng._M_x[0];
        pFVar20 = tmpfile();
        if (pFVar20 == (FILE *)0x0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x446,"GGML_ASSERT(%s) failed","file");
        }
        rng._M_x[0] = 0;
        rng._M_x[1] = 0;
        rng._M_x[2] = 0;
        gguf_write_to_buf((gguf_context *)uVar4,(vector *)&rng,bVar10);
        sVar24 = fwrite((void *)rng._M_x[0],1,rng._M_x[1] - rng._M_x[0],pFVar20);
        if (sVar24 != rng._M_x[1] - rng._M_x[0]) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-gguf.cpp"
                     ,0x44c,"GGML_ASSERT(%s) failed",
                     "fwrite(buf.data(), 1, buf.size(), file) == buf.size()");
        }
        rewind(pFVar20);
        std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                  ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&rng);
        _bad_magic = (pointer)0x0;
        pcVar48 = bad_magic;
        if (bVar10 != false) {
          pcVar48 = (char *)0x0;
        }
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pcVar48;
        pgVar34 = (gguf_context *)
                  gguf_init_from_file_impl(pFVar20,(gguf_init_params)(auVar3 << 0x40));
        printf("%s: same_version: ","test_roundtrip");
        iVar12 = gguf_get_version(uVar4);
        iVar16 = gguf_get_version(pgVar34);
        pcVar48 = "\x1b[1;31mFAIL\x1b[0m";
        if (iVar12 == iVar16) {
          pcVar48 = "\x1b[1;32mOK\x1b[0m";
        }
        puts(pcVar48);
        printf("%s: same_n_kv: ","test_roundtrip");
        lVar36 = gguf_get_n_kv(uVar4);
        lVar38 = gguf_get_n_kv(pgVar34);
        if (lVar36 == lVar38) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar17 = (iVar12 == iVar16) + 1;
        }
        else {
          uVar17 = (uint)(iVar12 == iVar16);
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: same_n_tensors: ","test_roundtrip");
        lVar36 = gguf_get_n_tensors(uVar4);
        lVar38 = gguf_get_n_tensors(pgVar34);
        if (lVar36 == lVar38) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar17 = uVar17 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_orig_kv_in_read: ","test_roundtrip");
        bVar53 = all_kv_in_other((gguf_context *)uVar4,pgVar34);
        if (bVar53) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar17 = uVar17 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_read_kv_in_orig: ","test_roundtrip");
        bVar53 = all_kv_in_other(pgVar34,(gguf_context *)uVar4);
        if (bVar53) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar17 = uVar17 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_orig_tensors_in_read: ","test_roundtrip");
        bVar53 = all_tensors_in_other((gguf_context *)uVar4,pgVar34);
        if (bVar53) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar17 = uVar17 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        printf("%s: all_read_tensors_in_orig: ","test_roundtrip");
        bVar53 = all_tensors_in_other(pgVar34,(gguf_context *)uVar4);
        if (bVar53) {
          puts("\x1b[1;32mOK\x1b[0m");
          uVar17 = uVar17 + 1;
        }
        else {
          puts("\x1b[1;31mFAIL\x1b[0m");
        }
        if (bVar10 == false) {
          printf("%s: same_tensor_data: ","test_roundtrip");
          _Var46._M_p = _bad_magic;
          lVar36 = ggml_get_first_tensor(uVar5);
          lVar38 = ggml_get_first_tensor(_Var46._M_p);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rng,(char *)(lVar38 + 0x100),(allocator<char> *)&n_2);
          bVar10 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&rng,"GGUF tensor data binary blob");
          std::__cxx11::string::~string((string *)&rng);
          if (bVar10) {
LAB_001078ad:
            puts("\x1b[1;31mFAIL\x1b[0m");
          }
          else {
            lVar38 = ggml_get_next_tensor(_Var46._M_p);
            bVar40 = 1;
            while (lVar36 != 0) {
              if (lVar38 == 0) goto LAB_001078ad;
              sVar28 = ggml_nbytes(lVar36);
              sVar30 = ggml_nbytes(lVar38);
              if (sVar30 != sVar28) goto LAB_001078ad;
              std::vector<char,_std::allocator<char>_>::vector
                        ((vector<char,_std::allocator<char>_> *)&rng,sVar28,(allocator_type *)&n_2);
              ggml_backend_tensor_get(lVar36,rng._M_x[0],0,sVar28);
              bVar10 = std::__equal<true>::equal<char>
                                 ((char *)rng._M_x[0],(char *)(sVar28 + rng._M_x[0]),
                                  *(char **)(lVar38 + 0xf8));
              lVar36 = ggml_get_next_tensor(uVar5,lVar36);
              lVar38 = ggml_get_next_tensor(_Var46._M_p);
              bVar40 = bVar40 & bVar10;
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)&rng);
            }
            if ((lVar38 == 0 & bVar40) != 1) goto LAB_001078ad;
            puts("\x1b[1;32mOK\x1b[0m");
            uVar17 = uVar17 + 1;
          }
          iVar12 = 8;
        }
        else {
          iVar12 = 7;
        }
        ggml_backend_buffer_free(uVar6);
        ggml_free(uVar5);
        ggml_free(_bad_magic);
        gguf_free(uVar4);
        gguf_free(pgVar34);
        ggml_backend_free(pgVar31);
        fclose(pFVar20);
        putchar(10);
        local_28a8 = local_28a8 + uVar17;
        local_28a4 = local_28a4 + iVar12;
        uVar25 = local_27d0 + 1;
      }
      pgVar31 = (ggml_backend_t)ggml_backend_dev_init(uVar29,0);
      uVar29 = ggml_backend_dev_description(uVar29);
      uVar32 = ggml_backend_name(pgVar31);
      printf("%s: device=%s, backend=%s\n","test_gguf_set_kv",uVar29,uVar32);
      get_random_gguf_context((random_gguf_context_result *)&rng,pgVar31,(uint)local_27c8);
      uVar8 = rng._M_x[2];
      uVar6 = rng._M_x[1];
      uVar4 = rng._M_x[0];
      get_random_gguf_context((random_gguf_context_result *)&rng,pgVar31,uVar13);
      uVar9 = rng._M_x[2];
      uVar7 = rng._M_x[1];
      uVar5 = rng._M_x[0];
      pgVar34 = (gguf_context *)gguf_init_empty();
      gguf_set_kv(uVar5,uVar4);
      gguf_set_kv(pgVar34,uVar4);
      printf("%s: same_n_kv: ","test_gguf_set_kv");
      lVar36 = gguf_get_n_kv(uVar4);
      lVar38 = gguf_get_n_kv(pgVar34);
      pcVar48 = "\x1b[1;31mFAIL\x1b[0m";
      if (lVar36 == lVar38) {
        pcVar48 = "\x1b[1;32mOK\x1b[0m";
      }
      puts(pcVar48);
      printf("%s: all_kv_0_in_1: ","test_gguf_set_kv");
      bVar10 = all_kv_in_other((gguf_context *)uVar4,(gguf_context *)uVar5);
      if (bVar10) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar17 = (lVar36 == lVar38) + 1;
      }
      else {
        uVar17 = (uint)(lVar36 == lVar38);
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      printf("%s: all_kv_0_in_2: ","test_gguf_set_kv");
      bVar10 = all_kv_in_other((gguf_context *)uVar4,pgVar34);
      if (bVar10) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar17 = uVar17 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      gguf_set_kv(uVar4,uVar5);
      printf("%s: same_n_kv_after_double_copy: ","test_gguf_set_kv");
      lVar36 = gguf_get_n_kv(uVar4);
      lVar38 = gguf_get_n_kv(uVar5);
      if (lVar36 == lVar38) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar17 = uVar17 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      printf("%s: all_kv_1_in_0_after_double_copy: ","test_gguf_set_kv");
      bVar10 = all_kv_in_other((gguf_context *)uVar5,(gguf_context *)uVar4);
      if (bVar10) {
        puts("\x1b[1;32mOK\x1b[0m");
        uVar17 = uVar17 + 1;
      }
      else {
        puts("\x1b[1;31mFAIL\x1b[0m");
      }
      ggml_backend_buffer_free(uVar8);
      ggml_backend_buffer_free(uVar9);
      ggml_free(uVar6);
      ggml_free(uVar7);
      gguf_free(uVar4);
      gguf_free(uVar5);
      gguf_free(pgVar34);
      ggml_backend_free(pgVar31);
      putchar(10);
      local_28a8 = local_28a8 + uVar17;
      local_28a4 = local_28a4 + 5;
    }
    printf("%d/%d tests passed\n",(ulong)local_28a8,(ulong)local_28a4);
    uVar13 = (uint)(local_28a8 != local_28a4);
    pcVar48 = "\x1b[1;32mOK\x1b[0m";
    if (local_28a8 != local_28a4) {
      pcVar48 = "\x1b[1;31mFAIL\x1b[0m";
    }
    puts(pcVar48);
    std::random_device::~random_device(&rd);
  }
  else {
    puts("usage: test-gguf [seed]");
    puts("  if no seed is unspecified then a random seed is used");
    uVar13 = 1;
  }
  return uVar13;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc > 2) {
        print_usage();
        return 1;
    }

    std::random_device rd;
    const unsigned int seed = argc < 2 ? rd() : std::stoi(argv[1]);

    // Initialize ggml backends early so the prints aren't interleaved with the test results:
    ggml_backend_dev_count();
    fprintf(stderr, "\n");

    int npass = 0;
    int ntest = 0;
    {
        std::pair<int, int> result = test_handcrafted_file(seed);
        npass += result.first;
        ntest += result.second;
    }

    for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);

        for (bool only_meta : {true, false}) {
            std::pair<int, int> result = test_roundtrip(dev, seed, only_meta);
            npass += result.first;
            ntest += result.second;
        }

        {
            std::pair<int, int> result = test_gguf_set_kv(dev, seed);
            npass += result.first;
            ntest += result.second;
        }
    }

    printf("%d/%d tests passed\n", npass, ntest);
    if (npass != ntest) {
        printf("\033[1;31mFAIL\033[0m\n");
        return 1;
    }
    printf("\033[1;32mOK\033[0m\n");
    return 0;
}